

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

TxoutType Solver(CScript *scriptPubKey,
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *vSolutionsRet)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  const_iterator __first;
  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __last;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  size_type sVar5;
  size_type sVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  keys;
  int required;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  undefined4 in_stack_fffffffffffffdb8;
  size_type in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffdc8;
  const_iterator in_stack_fffffffffffffdd8;
  allocator_type *in_stack_fffffffffffffde0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffde8;
  allocator_type *in_stack_fffffffffffffdf0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *__a;
  CScript *in_stack_fffffffffffffdf8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  const_iterator in_stack_fffffffffffffe00;
  undefined1 *puVar7;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  CScript *in_stack_fffffffffffffe10;
  valtype *pubkey;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  in_stack_fffffffffffffe20;
  const_iterator in_stack_fffffffffffffe28;
  const_iterator in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe40;
  TxoutType local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d1;
  undefined1 local_b8 [28];
  undefined1 local_9c;
  valtype local_98;
  uchar *local_80;
  int local_40;
  uchar *local_38;
  uchar *local_30;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  bVar1 = CScript::IsPayToScriptHash((CScript *)in_stack_fffffffffffffdc8);
  if (bVar1) {
    local_30 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbc);
    local_38 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbc);
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    __first.ptr._6_1_ = in_stack_fffffffffffffe0e;
    __first.ptr._0_6_ = in_stack_fffffffffffffe08;
    __first.ptr._7_1_ = in_stack_fffffffffffffe0f;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              (in_stack_fffffffffffffde8,__first,in_stack_fffffffffffffe00,in_stack_fffffffffffffde0
              );
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_fffffffffffffdc8,
                (value_type *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    local_108 = SCRIPTHASH;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
    goto LAB_00f75ff8;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  bVar1 = CScript::IsWitnessProgram
                    (in_stack_fffffffffffffe10,
                     (int *)CONCAT17(in_stack_fffffffffffffe0f,
                                     CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe00.ptr);
  if (bVar1) {
    if (local_40 == 0) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (sVar6 == 0x14) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    (value_type *)0xf7585b);
        local_108 = WITNESS_V0_KEYHASH;
        goto LAB_00f75fda;
      }
    }
    if (local_40 == 0) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (sVar6 == 0x20) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    (value_type *)0xf758c7);
        local_108 = WITNESS_V0_SCRIPTHASH;
        goto LAB_00f75fda;
      }
    }
    if (local_40 == 1) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (sVar6 == 0x20) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    (value_type *)0xf75916);
        local_108 = WITNESS_V1_TAPROOT;
        goto LAB_00f75fda;
      }
    }
    bVar1 = CScript::IsPayToAnchor((CScript *)in_stack_fffffffffffffdc8);
    if (bVar1) {
      local_108 = ANCHOR;
    }
    else if (local_40 == 0) {
      local_108 = NONSTANDARD;
    }
    else {
      local_9 = (undefined1)local_40;
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      __l._M_len._0_6_ = in_stack_fffffffffffffe08;
      __l._M_array = in_stack_fffffffffffffe00.ptr;
      __l._M_len._6_1_ = in_stack_fffffffffffffe0e;
      __l._M_len._7_1_ = in_stack_fffffffffffffe0f;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf8,
                 __l,in_stack_fffffffffffffdf0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                  (value_type *)0xf75a0a);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8)
      ;
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                  (value_type *)0xf75a3b);
      local_108 = WITNESS_UNKNOWN;
    }
  }
  else {
    sVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 & 0xffffff;
    if (sVar5 != 0) {
      in_stack_fffffffffffffe38 =
           (int *)prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
      in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 & 0xffffff;
      if ((uchar)*in_stack_fffffffffffffe38 == 'j') {
        in_stack_fffffffffffffe30 =
             prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        local_80 = in_stack_fffffffffffffe30.ptr;
        in_stack_fffffffffffffe20._M_current =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                       ((const_iterator *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdbc);
        in_stack_fffffffffffffe1f =
             CScript::IsPushOnly((CScript *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffe40 =
             CONCAT13(in_stack_fffffffffffffe1f,(int3)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe28._M_current = in_RDI;
      }
    }
    if ((char)(in_stack_fffffffffffffe40 >> 0x18) == '\0') {
      pubkey = &local_98;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      uVar2 = MatchPayToPubkey((CScript *)
                               CONCAT17(in_stack_fffffffffffffe1f,
                                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18
                                                )),pubkey);
      if ((bool)uVar2) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    (value_type *)0xf75c07);
        local_108 = PUBKEY;
      }
      else {
        uVar3 = MatchPayToPubkeyHash(in_stack_fffffffffffffdf8,(valtype *)in_stack_fffffffffffffdf0)
        ;
        if ((bool)uVar3) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                      (value_type *)0xf75c7b);
          local_108 = PUBKEYHASH;
        }
        else {
          puVar7 = local_b8;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          uVar4 = MatchMultisig((CScript *)CONCAT44(sVar5,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe38,
                                (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)in_stack_fffffffffffffe30.ptr);
          if ((bool)uVar4) {
            local_a = local_9c;
            this_00 = &local_d1;
            __a = in_RSI;
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            __l_00._M_len._0_6_ = in_stack_fffffffffffffe08;
            __l_00._M_array = puVar7;
            __l_00._M_len._6_1_ = uVar4;
            __l_00._M_len._7_1_ = uVar3;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (this_00,__l_00,(allocator_type *)__a);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                        (value_type *)0xf75d56);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffdc8);
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            this = in_RSI;
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
            __gnu_cxx::
            __normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*>
                      ((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffdc8,
                       (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::begin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
            __last._M_current._6_1_ = uVar2;
            __last._M_current._0_6_ = in_stack_fffffffffffffe18;
            __last._M_current._7_1_ = in_stack_fffffffffffffe1f;
            std::
            vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ::
            insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,void>
                      ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)this,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,__last);
            sVar6 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            local_b = (undefined1)sVar6;
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            __l_01._M_len._0_6_ = in_stack_fffffffffffffe08;
            __l_01._M_array = puVar7;
            __l_01._M_len._6_1_ = uVar4;
            __l_01._M_len._7_1_ = uVar3;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (this_00,__l_01,(allocator_type *)__a);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                        (value_type *)0xf75e88);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI);
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            local_108 = MULTISIG;
            in_stack_fffffffffffffdc8 = in_RSI;
          }
          else {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            local_108 = NONSTANDARD;
          }
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_fffffffffffffdc8);
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8)
      ;
    }
    else {
      local_108 = NULL_DATA;
    }
  }
LAB_00f75fda:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
LAB_00f75ff8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_108;
  }
  __stack_chk_fail();
}

Assistant:

TxoutType Solver(const CScript& scriptPubKey, std::vector<std::vector<unsigned char>>& vSolutionsRet)
{
    vSolutionsRet.clear();

    // Shortcut for pay-to-script-hash, which are more constrained than the other types:
    // it is always OP_HASH160 20 [20 byte hash] OP_EQUAL
    if (scriptPubKey.IsPayToScriptHash())
    {
        std::vector<unsigned char> hashBytes(scriptPubKey.begin()+2, scriptPubKey.begin()+22);
        vSolutionsRet.push_back(hashBytes);
        return TxoutType::SCRIPTHASH;
    }

    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_KEYHASH_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V0_KEYHASH;
        }
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V0_SCRIPTHASH;
        }
        if (witnessversion == 1 && witnessprogram.size() == WITNESS_V1_TAPROOT_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V1_TAPROOT;
        }
        if (scriptPubKey.IsPayToAnchor()) {
            return TxoutType::ANCHOR;
        }
        if (witnessversion != 0) {
            vSolutionsRet.push_back(std::vector<unsigned char>{(unsigned char)witnessversion});
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_UNKNOWN;
        }
        return TxoutType::NONSTANDARD;
    }

    // Provably prunable, data-carrying output
    //
    // So long as script passes the IsUnspendable() test and all but the first
    // byte passes the IsPushOnly() test we don't care what exactly is in the
    // script.
    if (scriptPubKey.size() >= 1 && scriptPubKey[0] == OP_RETURN && scriptPubKey.IsPushOnly(scriptPubKey.begin()+1)) {
        return TxoutType::NULL_DATA;
    }

    std::vector<unsigned char> data;
    if (MatchPayToPubkey(scriptPubKey, data)) {
        vSolutionsRet.push_back(std::move(data));
        return TxoutType::PUBKEY;
    }

    if (MatchPayToPubkeyHash(scriptPubKey, data)) {
        vSolutionsRet.push_back(std::move(data));
        return TxoutType::PUBKEYHASH;
    }

    int required;
    std::vector<std::vector<unsigned char>> keys;
    if (MatchMultisig(scriptPubKey, required, keys)) {
        vSolutionsRet.push_back({static_cast<unsigned char>(required)}); // safe as required is in range 1..20
        vSolutionsRet.insert(vSolutionsRet.end(), keys.begin(), keys.end());
        vSolutionsRet.push_back({static_cast<unsigned char>(keys.size())}); // safe as size is in range 1..20
        return TxoutType::MULTISIG;
    }

    vSolutionsRet.clear();
    return TxoutType::NONSTANDARD;
}